

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O2

void __thiscall FConsoleBuffer::FreeBrokenText(FConsoleBuffer *this,uint start,uint end)

{
  uint uVar1;
  FBrokenLines **ppFVar2;
  ulong uVar3;
  
  uVar1 = (this->mBrokenConsoleText).Count;
  if (uVar1 < end) {
    end = uVar1;
  }
  for (uVar3 = (ulong)start; uVar3 < end; uVar3 = uVar3 + 1) {
    ppFVar2 = (this->mBrokenConsoleText).Array;
    if (ppFVar2[uVar3] != (FBrokenLines *)0x0) {
      V_FreeBrokenLines(ppFVar2[uVar3]);
      ppFVar2 = (this->mBrokenConsoleText).Array;
    }
    ppFVar2[uVar3] = (FBrokenLines *)0x0;
  }
  return;
}

Assistant:

void FConsoleBuffer::FreeBrokenText(unsigned start, unsigned end)
{
	if (end > mBrokenConsoleText.Size()) end = mBrokenConsoleText.Size();
	for (unsigned i = start; i < end; i++)
	{
		if (mBrokenConsoleText[i] != NULL) V_FreeBrokenLines(mBrokenConsoleText[i]);
		mBrokenConsoleText[i] = NULL;
	}
}